

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_ftw.cpp
# Opt level: O1

void __thiscall edk2_ftw_t::_read(edk2_ftw_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  streamsize len;
  uint8_t uVar2;
  uint32_t uVar3;
  int iVar4;
  string local_38;
  
  kaitai::kstream::read_bytes_abi_cxx11_(&local_38,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_38);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_crc = uVar3;
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_state = uVar2;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_38,(this->super_kstruct).m__io,3);
  std::__cxx11::string::operator=((string *)&this->m_reserved,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_len_write_queue_32 = uVar3;
  this->n_len_write_queue_64 = true;
  iVar4 = kaitai::kstream::mod(uVar3,0x10);
  if (iVar4 == 0) {
    this->n_len_write_queue_64 = false;
    uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_write_queue_64 = uVar3;
  }
  this->n_write_queue_32 = true;
  iVar4 = kaitai::kstream::mod(this->m_len_write_queue_32,0x10);
  if (iVar4 == 4) {
    this->n_write_queue_32 = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_38,(this->super_kstruct).m__io,(ulong)this->m_len_write_queue_32);
    std::__cxx11::string::operator=((string *)&this->m_write_queue_32,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  this->n_write_queue_64 = true;
  iVar4 = kaitai::kstream::mod(this->m_len_write_queue_32,0x10);
  if (iVar4 == 0) {
    this->n_write_queue_64 = false;
    len._0_4_ = this->m_len_write_queue_32;
    len._4_4_ = this->m_len_write_queue_64;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_38,(this->super_kstruct).m__io,len);
    std::__cxx11::string::operator=((string *)&this->m_write_queue_64,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void edk2_ftw_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_crc = m__io->read_u4le();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_bytes(3);
    m_len_write_queue_32 = m__io->read_u4le();
    n_len_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_len_write_queue_64 = false;
        m_len_write_queue_64 = m__io->read_u4le();
    }
    n_write_queue_32 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 4) {
        n_write_queue_32 = false;
        m_write_queue_32 = m__io->read_bytes(len_write_queue_32());
    }
    n_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_write_queue_64 = false;
        m_write_queue_64 = m__io->read_bytes(((static_cast<uint64_t>(len_write_queue_64()) << 32) + len_write_queue_32()));
    }
}